

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O3

int __thiscall QMakeVfs::idForFileName(QMakeVfs *this,QString *fn,VfsFlags flags)

{
  byte bVar1;
  Entry *pEVar2;
  Node<QString,_int> *pNVar3;
  int iVar4;
  int *key;
  long in_FS_OFFSET;
  TryEmplaceResult local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)flags.super_QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>.
             super_QFlagsStorage<QMakeVfs::VfsFlag>.i & 0x10) == 0) {
    QHash<QString,int>::tryEmplace_impl<QString_const&>(&local_40,&s_fileIdMap,fn);
    pEVar2 = (local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].entries;
    bVar1 = (local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].offsets
            [(uint)local_40.iterator.i.bucket & 0x7f];
    iVar4 = *(int *)(pEVar2[bVar1].storage.data + 0x18);
    if (iVar4 != 0) goto LAB_00295c07;
    LOCK();
    UNLOCK();
    key = (int *)(pEVar2[bVar1].storage.data + 0x18);
    iVar4 = (int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1;
    s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (QAtomicInteger<int>)
         (QAtomicInteger<int>)
         ((int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + 1);
    *key = iVar4;
    QHash<int,QString>::tryEmplace_impl<int_const&>((TryEmplaceResult *)&local_40,&s_idFileMap,key);
    QString::operator=((QString *)
                       ((local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].entries
                        [(local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].offsets
                         [(uint)local_40.iterator.i.bucket & 0x7f]].storage.data + 8),(QString *)fn)
    ;
  }
  else {
    iVar4 = 0;
    if (s_fileIdMap.d == (Data *)0x0) goto LAB_00295c07;
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                       (s_fileIdMap.d,fn);
    if (pNVar3 == (Node<QString,_int> *)0x0) goto LAB_00295c07;
    key = &pNVar3->value;
  }
  iVar4 = *key;
LAB_00295c07:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QMakeVfs::idForFileName(const QString &fn, VfsFlags flags)
{
#ifdef PROEVALUATOR_DUAL_VFS
    {
# ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_vmutex);
# endif
        int idx = (flags & VfsCumulative) ? 1 : 0;
        if (flags & VfsCreate) {
            int &id = m_virtualFileIdMap[idx][fn];
            if (!id) {
                id = ++s_fileIdCounter;
                m_virtualIdFileMap[id] = fn;
            }
            return id;
        }
        int id = m_virtualFileIdMap[idx].value(fn);
        if (id || (flags & VfsCreatedOnly))
            return id;
    }
#endif
#ifdef PROPARSER_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!(flags & VfsAccessedOnly)) {
        int &id = s_fileIdMap[fn];
        if (!id) {
            id = ++s_fileIdCounter;
            s_idFileMap[id] = fn;
        }
        return id;
    }
    return s_fileIdMap.value(fn);
}